

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O3

size_t byte_decode(uint8_t *ibuff,size_t isize,uint64_t max,uint64_t *v)

{
  byte *pbVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (max - 1 == 0) {
    sVar4 = 0;
    uVar6 = 1;
  }
  else {
    uVar7 = 0;
    lVar5 = 0;
    sVar4 = 0;
    uVar8 = max - 1;
    do {
      pbVar1 = ibuff + sVar4;
      sVar4 = sVar4 + 1;
      uVar3 = uVar7 & 0x3f;
      uVar7 = uVar7 + 8;
      lVar5 = lVar5 + ((ulong)*pbVar1 << uVar3);
      bVar2 = 0xff < uVar8;
      uVar8 = uVar8 >> 8;
    } while (bVar2);
    uVar6 = lVar5 + 1;
  }
  *v = uVar6;
  return sVar4;
}

Assistant:

size_t byte_decode(
    const uint8_t* ibuff, size_t isize, uint64_t max, uint64_t* v)
{
    size_t ip = 0;
    uint64_t newv = 0;
    int offset = 0;
    max--; /* working here with zero-origin values */
    while (max) {
        // myassert(ip < isize);
        newv += (((uint64_t)ibuff[ip++]) << offset);
        max >>= 8;
        offset += 8;
    }
    *v = newv + 1;
    return ip;
}